

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spp.cpp
# Opt level: O0

void __thiscall
SPP::EarthRotationFix(SPP *this,double deltat,XYZ SatPosition,NavSys flag,XYZ *fixed)

{
  double *pdVar1;
  double dVar2;
  undefined1 local_60 [8];
  Vector3d result;
  double rate;
  Matrix3d R;
  Vector3d pos;
  XYZ *fixed_local;
  NavSys flag_local;
  double deltat_local;
  SPP *this_local;
  
  Matrix<double,_3,_1>::Matrix((Matrix<double,_3,_1> *)&R.data);
  Matrix<double,_3,_3>::Matrix((Matrix<double,_3,_3> *)&rate);
  if (flag == GPS) {
    result.data = (double *)0x3f131da7d7cb8d5b;
  }
  if (flag == BDS) {
    result.data = (double *)0x3f131da7d157db65;
  }
  pdVar1 = Matrix<double,_3,_1>::operator()((Matrix<double,_3,_1> *)&R.data,0,0);
  *pdVar1 = SatPosition.X;
  pdVar1 = Matrix<double,_3,_1>::operator()((Matrix<double,_3,_1> *)&R.data,1,0);
  *pdVar1 = SatPosition.Y;
  pdVar1 = Matrix<double,_3,_1>::operator()((Matrix<double,_3,_1> *)&R.data,2,0);
  *pdVar1 = SatPosition.Z;
  dVar2 = cos(deltat * (double)result.data);
  pdVar1 = Matrix<double,_3,_3>::operator()((Matrix<double,_3,_3> *)&rate,0,0);
  *pdVar1 = dVar2;
  dVar2 = sin(deltat * (double)result.data);
  pdVar1 = Matrix<double,_3,_3>::operator()((Matrix<double,_3,_3> *)&rate,0,1);
  *pdVar1 = dVar2;
  pdVar1 = Matrix<double,_3,_3>::operator()((Matrix<double,_3,_3> *)&rate,0,2);
  *pdVar1 = 0.0;
  dVar2 = sin(deltat * (double)result.data);
  pdVar1 = Matrix<double,_3,_3>::operator()((Matrix<double,_3,_3> *)&rate,1,0);
  *pdVar1 = -dVar2;
  dVar2 = cos(deltat * (double)result.data);
  pdVar1 = Matrix<double,_3,_3>::operator()((Matrix<double,_3,_3> *)&rate,1,1);
  *pdVar1 = dVar2;
  pdVar1 = Matrix<double,_3,_3>::operator()((Matrix<double,_3,_3> *)&rate,1,2);
  *pdVar1 = 0.0;
  pdVar1 = Matrix<double,_3,_3>::operator()((Matrix<double,_3,_3> *)&rate,2,0);
  *pdVar1 = 0.0;
  pdVar1 = Matrix<double,_3,_3>::operator()((Matrix<double,_3,_3> *)&rate,2,1);
  *pdVar1 = 0.0;
  pdVar1 = Matrix<double,_3,_3>::operator()((Matrix<double,_3,_3> *)&rate,2,2);
  *pdVar1 = 1.0;
  _local_60 = Matrix<double,3,3>::operator*
                        ((Matrix<double,3,3> *)&rate,(Matrix<double,_3,_1> *)&R.data);
  pdVar1 = Matrix<double,_3,_1>::operator()((Matrix<double,_3,_1> *)local_60,0,0);
  fixed->X = *pdVar1;
  pdVar1 = Matrix<double,_3,_1>::operator()((Matrix<double,_3,_1> *)local_60,1,0);
  fixed->Y = *pdVar1;
  pdVar1 = Matrix<double,_3,_1>::operator()((Matrix<double,_3,_1> *)local_60,2,0);
  fixed->Z = *pdVar1;
  Matrix<double,_3,_1>::deleteMatrix((Matrix<double,_3,_1> *)local_60);
  Matrix<double,_3,_1>::deleteMatrix((Matrix<double,_3,_1> *)&R.data);
  Matrix<double,_3,_3>::deleteMatrix((Matrix<double,_3,_3> *)&rate);
  return;
}

Assistant:

void SPP::EarthRotationFix(double deltat, XYZ SatPosition, NavSys flag, XYZ &fixed)
{
    Vector3d pos;
    Matrix3d R;
    double rate;
    if(flag == GPS)
        rate = GPSROTATIONRATE;
    if(flag == BDS)
        rate = BDSROTATIONRATE;
    // GPS
    pos(0, 0) = SatPosition.X;
    pos(1, 0) = SatPosition.Y;
    pos(2, 0) = SatPosition.Z;

    R(0, 0) = cos(deltat * rate);
    R(0, 1) = sin(deltat * rate);
    R(0, 2) = 0;

    R(1, 0) = -sin(deltat * rate);
    R(1, 1) = cos(deltat * rate);
    R(1, 2) = 0;

    R(2, 0) = 0;
    R(2, 1) = 0;
    R(2, 2) = 1;

    Vector3d result = R * pos;
    fixed.X = result(0, 0);
    fixed.Y = result(1, 0);
    fixed.Z = result(2, 0);

    result.deleteMatrix();
    pos.deleteMatrix();
    R.deleteMatrix();
}